

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O0

void Qentem::Digit::FastStringToNumber<unsigned_int,char>(uint *number,char *content,SizeT length)

{
  uint local_20;
  SizeT offset;
  SizeT length_local;
  char *content_local;
  uint *number_local;
  
  *number = 0;
  if (length != 0) {
    *number = (int)*content + *number;
    *number = *number - 0x30;
    for (local_20 = 1; local_20 < length; local_20 = local_20 + 1) {
      *number = *number * 10;
      *number = (int)content[local_20] + *number;
      *number = *number - 0x30;
    }
  }
  return;
}

Assistant:

static void FastStringToNumber(Number_T &number, const Char_T *content, SizeT length) noexcept {
        SizeT offset = 0;
        number       = 0;

        if (offset < length) {
            number += Number_T(content[offset]);
            number -= Number_T{DigitUtils::DigitChar::Zero};
            ++offset;

            while (offset < length) {
                number *= Number_T{10};
                number += Number_T(content[offset]);
                number -= Number_T{DigitUtils::DigitChar::Zero};
                ++offset;
            }
        }
    }